

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_functions.hpp
# Opt level: O0

longdouble * trng::math::detail::inv_Phi_approx<long_double>(longdouble x)

{
  longdouble *in_RAX;
  int *piVar1;
  longdouble *extraout_RAX;
  longdouble *extraout_RAX_00;
  double __x;
  double __x_00;
  longdouble in_stack_00000008;
  longdouble q_2;
  longdouble r;
  longdouble q_1;
  longdouble q;
  undefined8 in_stack_ffffffffffffff62;
  
  if ((in_stack_00000008 < (longdouble)0) || ((longdouble)1 < in_stack_00000008)) {
    piVar1 = __errno_location();
    *piVar1 = 0x21;
    in_RAX = std::numeric_limits<long_double>::quiet_NaN();
  }
  else if ((in_stack_00000008 != (longdouble)0) || (NAN(in_stack_00000008) || NAN((longdouble)0))) {
    if ((in_stack_00000008 != (longdouble)1) || (NAN(in_stack_00000008) || NAN((longdouble)1))) {
      if (_DAT_004683c0 <= in_stack_00000008) {
        if (_DAT_004683d0 <= in_stack_00000008) {
          ln1p((longdouble)
               CONCAT82(in_stack_ffffffffffffff62,(short)((unkuint10)-in_stack_00000008 >> 0x40)));
          std::sqrt(__x_00);
          in_RAX = extraout_RAX_00;
        }
      }
      else {
        ln((longdouble)
           CONCAT82(in_stack_ffffffffffffff62,(short)((unkuint10)in_stack_00000008 >> 0x40)));
        std::sqrt(__x);
        in_RAX = extraout_RAX;
      }
    }
    else {
      in_RAX = std::numeric_limits<long_double>::infinity();
    }
  }
  else {
    in_RAX = std::numeric_limits<long_double>::infinity();
  }
  return in_RAX;
}

Assistant:

TRNG_CUDA_ENABLE T inv_Phi_approx(T x) {
        using traits = inv_Phi_traits<T>;
        if (x < 0 or x > 1) {
#if !(defined TRNG_CUDA)
          errno = EDOM;
#endif
          return numeric_limits<T>::quiet_NaN();
        }
        if (x == 0)
          return -numeric_limits<T>::infinity();
        if (x == 1)
          return numeric_limits<T>::infinity();
        if (x < traits::x_low) {
          // rational approximation for lower region
          const T q{sqrt(-2 * ln(x))};
          return (((((traits::c[0] * q + traits::c[1]) * q + traits::c[2]) * q + traits::c[3]) *
                       q +
                   traits::c[4]) *
                      q +
                  traits::c[5]) /
                 ((((traits::d[0] * q + traits::d[1]) * q + traits::d[2]) * q + traits::d[3]) *
                      q +
                  1);
        } else if (x < traits::x_high) {
          // rational approximation for central region
          const T q{x - traits::one_half};
          const T r{q * q};
          return (((((traits::a[0] * r + traits::a[1]) * r + traits::a[2]) * r + traits::a[3]) *
                       r +
                   traits::a[4]) *
                      r +
                  traits::a[5]) *
                 q /
                 (((((traits::b[0] * r + traits::b[1]) * r + traits::b[2]) * r + traits::b[3]) *
                       r +
                   traits::b[4]) *
                      r +
                  1);
        } else {
          // rational approximation for upper region
          const T q{sqrt(-2 * ln1p(-x))};
          return -(((((traits::c[0] * q + traits::c[1]) * q + traits::c[2]) * q +
                     traits::c[3]) *
                        q +
                    traits::c[4]) *
                       q +
                   traits::c[5]) /
                 ((((traits::d[0] * q + traits::d[1]) * q + traits::d[2]) * q + traits::d[3]) *
                      q +
                  1);
        }
      }